

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O2

int ncnn::reduction_op<ncnn::reduction_op_add<float>,ncnn::reduction_op_add<float>>
              (Mat *a,Mat *b,float v0,bool reduce_w,bool reduce_h,bool reduce_c,Option *opt)

{
  size_t sVar1;
  bool bVar2;
  int i_1;
  void *pvVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  void *pvVar10;
  int q;
  int _c;
  long lVar11;
  ulong uVar12;
  int iVar13;
  uint _w;
  uint uVar14;
  uint uVar15;
  float fVar16;
  int local_d8;
  Mat sums;
  Mat local_78;
  
  sVar1 = a->elemsize;
  iVar13 = a->dims;
  if (iVar13 == 3) {
    uVar5 = a->w;
    lVar11 = (long)(int)uVar5;
    uVar15 = a->h;
    _w = a->c;
    uVar7 = (ulong)_w;
    uVar14 = uVar15 * uVar5;
    bVar2 = !reduce_h;
    if ((!reduce_w || bVar2) || !reduce_c) {
      if ((reduce_w && !bVar2) && !reduce_c) {
        Mat::create(b,_w,sVar1,opt->blob_allocator);
        if ((int)uVar14 < 1) {
          uVar14 = 0;
        }
        if ((int)_w < 1) {
          uVar7 = 0;
        }
        for (uVar6 = 0; uVar6 != uVar7; uVar6 = uVar6 + 1) {
          Mat::channel(&sums,a,(int)uVar6);
          pvVar3 = sums.data;
          Mat::~Mat(&sums);
          fVar16 = 0.0;
          for (uVar9 = 0; uVar14 != uVar9; uVar9 = uVar9 + 1) {
            fVar16 = fVar16 + *(float *)((long)pvVar3 + uVar9 * 4);
          }
          *(float *)((long)b->data + uVar6 * 4) = fVar16;
        }
        return 0;
      }
      if ((reduce_w && !reduce_h) && !reduce_c) {
        Mat::create(b,uVar15,_w,sVar1,opt->blob_allocator);
        uVar6 = 0;
        if (0 < (int)uVar5) {
          uVar6 = (ulong)uVar5;
        }
        if ((int)uVar15 < 1) {
          uVar15 = 0;
        }
        if ((int)_w < 1) {
          uVar7 = 0;
        }
        for (uVar9 = 0; uVar9 != uVar7; uVar9 = uVar9 + 1) {
          Mat::channel(&sums,a,(int)uVar9);
          pvVar10 = sums.data;
          Mat::~Mat(&sums);
          iVar13 = b->w;
          sVar1 = b->elemsize;
          pvVar3 = b->data;
          for (uVar12 = 0; uVar12 != uVar15; uVar12 = uVar12 + 1) {
            fVar16 = 0.0;
            for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
              fVar16 = fVar16 + *(float *)((long)pvVar10 + uVar8 * 4);
            }
            *(float *)((long)pvVar3 + uVar12 * 4 + (long)iVar13 * uVar9 * sVar1) = fVar16;
            pvVar10 = (void *)((long)pvVar10 + lVar11 * 4);
          }
        }
        return 0;
      }
      if ((reduce_w && !reduce_h) && reduce_c) {
        Mat::create(b,uVar15,sVar1,opt->blob_allocator);
        Mat::Mat(&sums,1,uVar15,_w,sVar1,opt->workspace_allocator);
        iVar13 = -100;
        if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
          Mat::fill(&sums,0.0);
          uVar6 = 0;
          uVar9 = 0;
          if (0 < (int)uVar5) {
            uVar9 = (ulong)uVar5;
          }
          uVar12 = (ulong)uVar15;
          if ((int)uVar15 < 1) {
            uVar12 = uVar6;
          }
          if ((int)_w < 1) {
            uVar7 = uVar6;
          }
          while( true ) {
            local_d8 = (int)uVar7;
            iVar13 = (int)uVar6;
            if (iVar13 == local_d8) break;
            Mat::channel(&local_78,a,iVar13);
            pvVar3 = local_78.data;
            Mat::~Mat(&local_78);
            Mat::channel(&local_78,&sums,iVar13);
            pvVar10 = local_78.data;
            Mat::~Mat(&local_78);
            for (uVar6 = 0; uVar6 != uVar12; uVar6 = uVar6 + 1) {
              fVar16 = 0.0;
              for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
                fVar16 = fVar16 + *(float *)((long)pvVar3 + uVar8 * 4);
              }
              *(float *)((long)pvVar10 + uVar6 * 4) = fVar16;
              pvVar3 = (void *)((long)pvVar3 + lVar11 * 4);
            }
            uVar6 = (ulong)(iVar13 + 1);
          }
          Mat::fill(b,0.0);
          for (_c = 0; iVar13 = 0, _c != local_d8; _c = _c + 1) {
            Mat::channel(&local_78,&sums,_c);
            pvVar10 = local_78.data;
            Mat::~Mat(&local_78);
            pvVar3 = b->data;
            for (uVar7 = 0; uVar12 != uVar7; uVar7 = uVar7 + 1) {
              *(float *)((long)pvVar3 + uVar7 * 4) =
                   *(float *)((long)pvVar10 + uVar7 * 4) + *(float *)((long)pvVar3 + uVar7 * 4);
            }
          }
        }
      }
      else {
        if ((bVar2 || reduce_w) || !reduce_c) {
          if ((!reduce_w && !reduce_h) && reduce_c) {
            Mat::create(b,uVar5,uVar15,sVar1,opt->blob_allocator);
            Mat::fill(b,0.0);
            if ((int)uVar14 < 1) {
              uVar14 = 0;
            }
            if ((int)_w < 1) {
              _w = 0;
            }
            for (uVar5 = 0; uVar5 != _w; uVar5 = uVar5 + 1) {
              Mat::channel(&sums,a,uVar5);
              pvVar10 = sums.data;
              Mat::~Mat(&sums);
              pvVar3 = b->data;
              for (uVar7 = 0; uVar14 != uVar7; uVar7 = uVar7 + 1) {
                *(float *)((long)pvVar3 + uVar7 * 4) =
                     *(float *)((long)pvVar10 + uVar7 * 4) + *(float *)((long)pvVar3 + uVar7 * 4);
              }
            }
            return 0;
          }
          if ((!bVar2 && !reduce_w) && !reduce_c) {
            Mat::create(b,uVar5,_w,sVar1,opt->blob_allocator);
            Mat::fill(b,0.0);
            uVar6 = 0;
            if (0 < (int)uVar5) {
              uVar6 = (ulong)uVar5;
            }
            if ((int)uVar15 < 1) {
              uVar15 = 0;
            }
            if ((int)_w < 1) {
              uVar7 = 0;
            }
            for (uVar9 = 0; uVar9 != uVar7; uVar9 = uVar9 + 1) {
              Mat::channel(&sums,a,(int)uVar9);
              pvVar10 = sums.data;
              Mat::~Mat(&sums);
              lVar4 = b->elemsize * uVar9 * (long)b->w;
              pvVar3 = b->data;
              for (uVar5 = 0; uVar5 != uVar15; uVar5 = uVar5 + 1) {
                for (uVar12 = 0; uVar6 != uVar12; uVar12 = uVar12 + 1) {
                  *(float *)((long)pvVar3 + uVar12 * 4 + lVar4) =
                       *(float *)((long)pvVar10 + uVar12 * 4) +
                       *(float *)((long)pvVar3 + uVar12 * 4 + lVar4);
                }
                pvVar10 = (void *)((long)pvVar10 + lVar11 * 4);
              }
            }
            return 0;
          }
          return 0;
        }
        Mat::create(b,uVar5,sVar1,opt->blob_allocator);
        Mat::Mat(&sums,uVar5,1,_w,sVar1,opt->workspace_allocator);
        iVar13 = -100;
        if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
          Mat::fill(&sums,0.0);
          uVar14 = 0;
          uVar7 = 0;
          if (0 < (int)uVar5) {
            uVar7 = (ulong)uVar5;
          }
          if ((int)uVar15 < 1) {
            uVar15 = 0;
          }
          if ((int)_w < 1) {
            _w = 0;
          }
          for (; uVar14 != _w; uVar14 = uVar14 + 1) {
            Mat::channel(&local_78,a,uVar14);
            pvVar3 = local_78.data;
            Mat::~Mat(&local_78);
            Mat::channel(&local_78,&sums,uVar14);
            pvVar10 = local_78.data;
            Mat::~Mat(&local_78);
            for (uVar5 = 0; uVar5 != uVar15; uVar5 = uVar5 + 1) {
              for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
                *(float *)((long)pvVar10 + uVar6 * 4) =
                     *(float *)((long)pvVar3 + uVar6 * 4) + *(float *)((long)pvVar10 + uVar6 * 4);
              }
              pvVar3 = (void *)((long)pvVar3 + lVar11 * 4);
            }
          }
          Mat::fill(b,0.0);
          iVar13 = 0;
          for (uVar5 = 0; uVar5 != _w; uVar5 = uVar5 + 1) {
            Mat::channel(&local_78,&sums,uVar5);
            pvVar10 = local_78.data;
            Mat::~Mat(&local_78);
            pvVar3 = b->data;
            for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
              *(float *)((long)pvVar3 + uVar6 * 4) =
                   *(float *)((long)pvVar10 + uVar6 * 4) + *(float *)((long)pvVar3 + uVar6 * 4);
            }
          }
        }
      }
      goto LAB_001ee6b8;
    }
    Mat::create(b,1,sVar1,opt->blob_allocator);
    Mat::Mat(&sums,_w,sVar1,opt->workspace_allocator);
    iVar13 = -100;
    if ((sums.data == (void *)0x0) || ((long)sums.c * sums.cstep == 0)) goto LAB_001ee6b8;
    uVar9 = 0;
    uVar6 = (ulong)uVar14;
    if ((int)uVar14 < 1) {
      uVar6 = uVar9;
    }
    if ((int)_w < 1) {
      uVar7 = uVar9;
    }
    for (; uVar9 != uVar7; uVar9 = uVar9 + 1) {
      Mat::channel(&local_78,a,(int)uVar9);
      pvVar3 = local_78.data;
      Mat::~Mat(&local_78);
      fVar16 = 0.0;
      for (uVar12 = 0; uVar6 != uVar12; uVar12 = uVar12 + 1) {
        fVar16 = fVar16 + *(float *)((long)pvVar3 + uVar12 * 4);
      }
      *(float *)((long)sums.data + uVar9 * 4) = fVar16;
    }
    fVar16 = 0.0;
    for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      fVar16 = fVar16 + *(float *)((long)sums.data + uVar6 * 4);
    }
  }
  else {
    if (iVar13 != 2) {
      if (iVar13 == 1) {
        uVar5 = a->w;
        Mat::create(b,1,sVar1,opt->blob_allocator);
        uVar6 = 0;
        uVar7 = (ulong)uVar5;
        if ((int)uVar5 < 1) {
          uVar7 = uVar6;
        }
        fVar16 = 0.0;
        for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
          fVar16 = fVar16 + *(float *)((long)a->data + uVar6 * 4);
        }
        *(float *)b->data = fVar16;
        return 0;
      }
      return 0;
    }
    uVar5 = a->w;
    uVar15 = a->h;
    if (!reduce_w || !reduce_h) {
      if (reduce_w && !reduce_h) {
        Mat::create(b,uVar15,sVar1,opt->blob_allocator);
        pvVar3 = a->data;
        iVar13 = a->w;
        sVar1 = a->elemsize;
        pvVar10 = b->data;
        uVar7 = (ulong)uVar5;
        if ((int)uVar5 < 1) {
          uVar7 = 0;
        }
        uVar6 = (ulong)uVar15;
        if ((int)uVar15 < 1) {
          uVar6 = 0;
        }
        for (uVar9 = 0; uVar9 != uVar6; uVar9 = uVar9 + 1) {
          fVar16 = 0.0;
          for (uVar12 = 0; uVar7 != uVar12; uVar12 = uVar12 + 1) {
            fVar16 = fVar16 + *(float *)((long)pvVar3 + uVar12 * 4);
          }
          *(float *)((long)pvVar10 + uVar9 * 4) = fVar16;
          pvVar3 = (void *)((long)pvVar3 + (long)iVar13 * sVar1);
        }
        return 0;
      }
      if (reduce_h && !reduce_w) {
        Mat::create(b,uVar5,sVar1,opt->blob_allocator);
        Mat::fill(b,0.0);
        pvVar3 = a->data;
        iVar13 = a->w;
        sVar1 = a->elemsize;
        uVar7 = (ulong)uVar5;
        if ((int)uVar5 < 1) {
          uVar7 = 0;
        }
        uVar6 = (ulong)uVar15;
        if ((int)uVar15 < 1) {
          uVar6 = 0;
        }
        for (uVar9 = 0; uVar9 != uVar6; uVar9 = uVar9 + 1) {
          pvVar10 = b->data;
          for (uVar12 = 0; uVar7 != uVar12; uVar12 = uVar12 + 1) {
            *(float *)((long)pvVar10 + uVar12 * 4) =
                 *(float *)((long)pvVar3 + uVar12 * 4) + *(float *)((long)pvVar10 + uVar12 * 4);
          }
          pvVar3 = (void *)((long)pvVar3 + (long)iVar13 * sVar1);
        }
        return 0;
      }
      return 0;
    }
    Mat::create(b,1,sVar1,opt->blob_allocator);
    Mat::Mat(&sums,uVar15,sVar1,opt->workspace_allocator);
    iVar13 = -100;
    if ((sums.data == (void *)0x0) || ((long)sums.c * sums.cstep == 0)) goto LAB_001ee6b8;
    iVar13 = a->w;
    sVar1 = a->elemsize;
    uVar6 = 0;
    uVar7 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar7 = uVar6;
    }
    pvVar3 = a->data;
    uVar9 = (ulong)uVar15;
    if ((int)uVar15 < 1) {
      uVar9 = uVar6;
    }
    for (; fVar16 = 0.0, uVar6 != uVar9; uVar6 = uVar6 + 1) {
      for (uVar12 = 0; uVar7 != uVar12; uVar12 = uVar12 + 1) {
        fVar16 = fVar16 + *(float *)((long)pvVar3 + uVar12 * 4);
      }
      *(float *)((long)sums.data + uVar6 * 4) = fVar16;
      pvVar3 = (void *)((long)pvVar3 + (long)iVar13 * sVar1);
    }
    for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
      fVar16 = fVar16 + *(float *)((long)sums.data + uVar7 * 4);
    }
  }
  *(float *)b->data = fVar16;
  iVar13 = 0;
LAB_001ee6b8:
  Mat::~Mat(&sums);
  return iVar13;
}

Assistant:

static int reduction_op(const Mat& a, Mat& b, float v0, bool reduce_w, bool reduce_h, bool reduce_c, const Option& opt)
{
    Op op;
    Op2 op2;

    size_t elemsize = a.elemsize;
    int dims = a.dims;

    if (dims == 1)
    {
        int w = a.w;
        b.create(1, elemsize, opt.blob_allocator);
        const float* ptr = a;

        float sum = v0;
        for (int i = 0; i < w; i++)
        {
            sum = op(sum, ptr[i]);
        }
        b[0] = sum;

        return 0;
    }

    if (dims == 2)
    {
        int w = a.w;
        int h = a.h;

        if (reduce_w && reduce_h)
        {
            // w h -> X X
            b.create(1, elemsize, opt.blob_allocator);

            Mat sums(h, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j = 0; j < w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                sums[i] = sum;
            }

            float sum = v0;
            for (int i = 0; i < h; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && !reduce_h)
        {
            // w h -> X h
            b.create(h, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j = 0; j < w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                b[i] = sum;
            }
            return 0;
        }

        if (!reduce_w && reduce_h)
        {
            // w h -> w X
            b.create(w, elemsize, opt.blob_allocator);
            b.fill(v0);

            for (int i = 0; i < h; i++)
            {
                const float* ptr = a.row(i);
                for (int j = 0; j < w; j++)
                {
                    b[j] = op(b[j], ptr[j]);
                }
            }
            return 0;
        }
    }

    if (dims == 3)
    {
        int w = a.w;
        int h = a.h;
        int channels = a.c;
        int size = w * h;

        if (reduce_w && reduce_h && reduce_c)
        {
            // w h c -> X X X
            b.create(1, elemsize, opt.blob_allocator);
            Mat sums(channels, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);

                float sum = v0;
                for (int i = 0; i < size; i++)
                {
                    sum = op(sum, ptr[i]);
                }
                sums[q] = sum;
            }

            float sum = v0;
            for (int i = 0; i < channels; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> X X c
            b.create(channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);

                float sum = v0;
                for (int i = 0; i < size; i++)
                {
                    sum = op(sum, ptr[i]);
                }
                b[q] = sum;
            }

            return 0;
        }

        if (reduce_w && !reduce_h && !reduce_c)
        {
            // w h c -> X h c
            b.create(h, channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.row(q);

                for (int i = 0; i < h; i++)
                {
                    float sum = v0;
                    for (int j = 0; j < w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    outptr[i] = sum;
                    ptr += w;
                }
            }

            return 0;
        }

        if (reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> X h X
            b.create(h, elemsize, opt.blob_allocator);
            Mat mins(1, h, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i = 0; i < h; i++)
                {
                    float sum = v0;
                    for (int j = 0; j < w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    mins_ptr[i] = sum;
                    ptr += w;
                }
            }

            b.fill(v0);

            for (int q = 0; q < channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int i = 0; i < h; i++)
                {
                    b[i] = op2(b[i], mins_ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && reduce_c)
        {
            // w h c -> w X X
            b.create(w, elemsize, opt.blob_allocator);

            Mat mins(w, 1, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i = 0; i < h; i++)
                {
                    for (int j = 0; j < w; j++)
                    {
                        mins_ptr[j] = op(mins_ptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }

            b.fill(v0);

            for (int q = 0; q < channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int j = 0; j < w; j++)
                {
                    b[j] = op2(b[j], mins_ptr[j]);
                }
            }

            return 0;
        }

        if (!reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> w h X
            b.create(w, h, elemsize, opt.blob_allocator);

            b.fill(v0);

            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);

                for (int i = 0; i < size; i++)
                {
                    b[i] = op(b[i], ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> w X c
            b.create(w, channels, elemsize, opt.blob_allocator);

            b.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.row(q);

                for (int i = 0; i < h; i++)
                {
                    for (int j = 0; j < w; j++)
                    {
                        outptr[j] = op(outptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }
            return 0;
        }
    }

    return 0;
}